

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

int MAFSA_automaton_str_to_int_pair(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = uVar2;
  if (sz_l != 0) {
    do {
      uVar3 = uVar2;
      if (l[uVar2] == delim) break;
      uVar2 = uVar2 + 1;
      uVar3 = sz_l;
    } while (sz_l != uVar2);
  }
  iVar1 = MAFSA_automaton_val_to_int_pair(l + uVar3 + 1,~uVar3 + sz_l,delim,out);
  return iVar1;
}

Assistant:

extern int MAFSA_automaton_str_to_int_pair(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;

    for (i = 0; i < sz_l; ++i)
    {
        if (delim == l[i])
        {
            break;
        }
    }

    return MAFSA_automaton_val_to_int_pair(l + i + 1,
        sz_l - i - 1, delim, out);
}